

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

try_get_result_type * __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::try_get(try_get_result_type *__return_storage_ptr__,
         olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
         *this,art_key_type k)

{
  atomic<long> *paVar1;
  long lVar2;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> shifted_key;
  qsbr_ptr<const_std::byte> qVar3;
  bool bVar4;
  uint uVar5;
  uintptr_t uVar6;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
  *this_00;
  find_result fVar7;
  qsbr_ptr_span<const_std::byte> local_a0;
  undefined1 local_90 [8];
  value_view val_view;
  undefined1 auStack_60 [8];
  read_critical_section parent_critical_section;
  undefined1 auStack_48 [8];
  read_critical_section node_critical_section;
  
  optimistic_lock::try_read_lock((optimistic_lock *)auStack_60);
  if (auStack_60 != (undefined1  [8])0x0) {
    uVar6 = (this->root).value._M_i.tagged_ptr;
    if (uVar6 == 0) {
      if ((((atomic<long> *)((long)auStack_60 + 8))->super___atomic_base<long>)._M_i < 1) {
LAB_0016419e:
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      if (parent_critical_section.lock == *(optimistic_lock **)auStack_60) {
        LOCK();
        paVar1 = (atomic<long> *)((long)auStack_60 + 8);
        lVar2 = (paVar1->super___atomic_base<long>)._M_i;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
LAB_001641bd:
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
        auStack_60 = (undefined1  [8])0x0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>
                 ._M_payload + 0x10) = 0;
        (__return_storage_ptr__->
        super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
        .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>.
        _M_engaged = true;
        goto LAB_00164131;
      }
      optimistic_lock::dec_read_lock_count((optimistic_lock *)auStack_60);
      auStack_60 = (undefined1  [8])0x0;
    }
    else {
      bVar4 = optimistic_lock::read_critical_section::check((read_critical_section *)auStack_60);
      if (bVar4) {
        val_view._M_extent._M_extent_value = k.field_0._0_8_;
        parent_critical_section.version.version = (version_tag_type)__return_storage_ptr__;
        while( true ) {
          this_00 = (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
                     *)(uVar6 & 0xfffffffffffffff8);
          optimistic_lock::try_read_lock((optimistic_lock *)auStack_48);
          __return_storage_ptr__ = (try_get_result_type *)parent_critical_section.version;
          if (auStack_48 == (undefined1  [8])0x0) break;
          if ((((atomic<long> *)((long)auStack_60 + 8))->super___atomic_base<long>)._M_i < 1)
          goto LAB_0016419e;
          if (parent_critical_section.lock != *(optimistic_lock **)auStack_60) {
            optimistic_lock::dec_read_lock_count((optimistic_lock *)auStack_60);
            auStack_60 = (undefined1  [8])0x0;
            __return_storage_ptr__ = (try_get_result_type *)parent_critical_section.version;
            break;
          }
          LOCK();
          paVar1 = (atomic<long> *)((long)auStack_60 + 8);
          lVar2 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_001641bd;
          auStack_60 = (undefined1  [8])0x0;
          if ((uVar6 & 7) == 0) {
            bVar4 = detail::
                    basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
                    ::matches(this_00,(art_key_type)k.field_0);
            __return_storage_ptr__ = (try_get_result_type *)parent_critical_section.version;
            if (bVar4) {
              val_view._M_ptr = (pointer)(ulong)this_00->value_size;
              local_90 = (undefined1  [8])(this_00->data + this_00->key_size);
              if ((((atomic<long> *)((long)auStack_48 + 8))->super___atomic_base<long>)._M_i < 1)
              goto LAB_0016419e;
              if (node_critical_section.lock == *(optimistic_lock **)auStack_48) {
                LOCK();
                paVar1 = (atomic<long> *)((long)auStack_48 + 8);
                lVar2 = (paVar1->super___atomic_base<long>)._M_i;
                (paVar1->super___atomic_base<long>)._M_i =
                     (paVar1->super___atomic_base<long>)._M_i + -1;
                UNLOCK();
                if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
                goto LAB_001641bd;
                auStack_48 = (undefined1  [8])0x0;
                qsbr_ptr_span<const_std::byte>::qsbr_ptr_span
                          (&local_a0,(span<const_std::byte,_18446744073709551615UL> *)local_90);
                qVar3.ptr = local_a0.start.ptr;
                local_a0.start.ptr = (pointer)0x0;
                *(pointer *)__return_storage_ptr__ = qVar3.ptr;
                *(size_t *)((long)__return_storage_ptr__ + 8) = local_a0.length;
                *(undefined1 *)((long)__return_storage_ptr__ + 0x10) = 1;
                *(undefined1 *)((long)__return_storage_ptr__ + 0x18) = 1;
                qsbr_ptr<const_std::byte>::~qsbr_ptr(&local_a0.start);
                goto LAB_00164128;
              }
            }
            else {
              if ((((atomic<long> *)((long)auStack_48 + 8))->super___atomic_base<long>)._M_i < 1)
              goto LAB_0016419e;
              if (node_critical_section.lock == *(optimistic_lock **)auStack_48) goto LAB_0016410e;
            }
LAB_00164192:
            __return_storage_ptr__ = (try_get_result_type *)parent_critical_section.version.version;
            optimistic_lock::dec_read_lock_count((optimistic_lock *)auStack_48);
            auStack_48 = (undefined1  [8])0x0;
            break;
          }
          node_critical_section.version.version._7_1_ =
               detail::
               key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
               ::length((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                         *)&this_00->key_size);
          shifted_key.field_0.key._M_extent._M_extent_value =
               (__extent_storage<18446744073709551615UL>)
               (__extent_storage<18446744073709551615UL>)k.field_0._8_8_;
          shifted_key.field_0.key._M_ptr = (pointer)val_view._M_extent._M_extent_value;
          uVar5 = detail::
                  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                  ::get_shared_length((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                                       *)&this_00->key_size,shifted_key);
          if (uVar5 < node_critical_section.version.version._7_1_) {
LAB_0016401c:
            if ((((atomic<long> *)((long)auStack_48 + 8))->super___atomic_base<long>)._M_i < 1)
            goto LAB_0016419e;
            if (node_critical_section.lock != *(optimistic_lock **)auStack_48) goto LAB_00164192;
LAB_0016410e:
            LOCK();
            paVar1 = (atomic<long> *)((long)auStack_48 + 8);
            lVar2 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_001641bd;
            auStack_48 = (undefined1  [8])0x0;
            *(undefined1 *)(parent_critical_section.version.version + 0x10) = 0;
            *(undefined1 *)(parent_critical_section.version.version + 0x18) = 1;
            __return_storage_ptr__ = (try_get_result_type *)parent_critical_section.version.version;
            goto LAB_00164128;
          }
          if (uVar5 != node_critical_section.version.version._7_1_) {
            __assert_fail("shared_key_prefix_length == key_prefix_length",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                          ,0x6d4,
                          "typename olc_db<Key, Value>::try_get_result_type unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::try_get(art_key_type) const [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                         );
          }
          detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::shift_right
                    ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                     &val_view._M_extent,(ulong)node_critical_section.version.version._7_1_);
          fVar7 = detail::
                  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                  ::find_child((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                *)this_00,(node_type)uVar6 & (I256|I48),
                               *(byte *)val_view._M_extent._M_extent_value);
          if (fVar7.second ==
              (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *
              )0x0) goto LAB_0016401c;
          uVar6 = ((fVar7.second)->value)._M_i.tagged_ptr;
          auStack_60 = auStack_48;
          parent_critical_section.lock = node_critical_section.lock;
          auStack_48 = (undefined1  [8])0x0;
          detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::shift_right
                    ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                     &val_view._M_extent,1);
          bVar4 = optimistic_lock::read_critical_section::check((read_critical_section *)auStack_60)
          ;
          __return_storage_ptr__ = (try_get_result_type *)parent_critical_section.version;
          if (!bVar4) break;
          optimistic_lock::read_critical_section::~read_critical_section
                    ((read_critical_section *)auStack_48);
        }
        (__return_storage_ptr__->
        super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
        .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>.
        _M_engaged = false;
LAB_00164128:
        optimistic_lock::read_critical_section::~read_critical_section
                  ((read_critical_section *)auStack_48);
        goto LAB_00164131;
      }
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>).
  _M_payload.
  super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
  .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>._M_engaged =
       false;
LAB_00164131:
  optimistic_lock::read_critical_section::~read_critical_section
            ((read_critical_section *)auStack_60);
  return __return_storage_ptr__;
}

Assistant:

typename olc_db<Key, Value>::try_get_result_type olc_db<Key, Value>::try_get(
    art_key_type k) const noexcept {
  auto parent_critical_section = root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  detail::olc_node_ptr node{root.load()};  // load root into [node].

  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {  // special path if empty tree.
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock())) {
      // LCOV_EXCL_START
      spin_wait_loop_body();
      return {};
      // LCOV_EXCL_STOP
    }
    // return an empty result (breaks out of caller's while(true) loop)
    return std::make_optional<get_result>(std::nullopt);
  }

  // A check() is required before acting on [node] by taking the lock.
  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  auto remaining_key{k};

  while (true) {
    // Lock version chaining (node and parent)
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart())) return {};
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const auto node_type = node.type();

    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.ptr<leaf_type*>()};
      if (leaf->matches(k)) {
        const auto val_view{leaf->get_value_view()};
        if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
          return {};  // LCOV_EXCL_LINE
        return qsbr_ptr_span<const std::byte>{val_view};
      }
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      return std::make_optional<get_result>(std::nullopt);
    }

    auto* const inode{node.ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_key_prefix_length{
        key_prefix.get_shared_length(remaining_key)};

    if (shared_key_prefix_length < key_prefix_length) {
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      return std::make_optional<get_result>(std::nullopt);
    }

    UNODB_DETAIL_ASSERT(shared_key_prefix_length == key_prefix_length);

    remaining_key.shift_right(key_prefix_length);

    const auto* const child_in_parent{
        inode->find_child(node_type, remaining_key[0]).second};

    if (child_in_parent == nullptr) {
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      return std::make_optional<get_result>(std::nullopt);
    }

    const auto child = child_in_parent->load();

    parent_critical_section = std::move(node_critical_section);
    node = child;
    remaining_key.shift_right(1);

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) return {};
  }
}